

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_entropy.c
# Opt level: O1

double inform_block_entropy(int *series,size_t n,size_t m,int b,size_t k,inform_error *err)

{
  _Bool _Var1;
  uint32_t *__ptr;
  long lVar2;
  size_t sVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong __nmemb;
  double dVar9;
  undefined1 auVar10 [16];
  inform_dist states;
  inform_dist local_48;
  
  _Var1 = check_arguments(series,n,m,b,k,err);
  dVar9 = NAN;
  if (!_Var1) {
    auVar10._8_4_ = (int)(k >> 0x20);
    auVar10._0_8_ = k;
    auVar10._12_4_ = 0x45300000;
    dVar9 = pow((double)b,
                (auVar10._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)k) - 4503599627370496.0));
    __nmemb = (long)(dVar9 - 9.223372036854776e+18) & (long)dVar9 >> 0x3f | (long)dVar9;
    __ptr = (uint32_t *)calloc(__nmemb,4);
    if (__ptr == (uint32_t *)0x0) {
      if (err != (inform_error *)0x0) {
        *err = INFORM_ENOMEM;
      }
      dVar9 = NAN;
    }
    else {
      lVar2 = (m - k) + 1;
      local_48.counts = lVar2 * n;
      if (n != 0) {
        sVar3 = 0;
        do {
          if (k == 1) {
            iVar4 = 1;
            iVar5 = 0;
          }
          else {
            uVar7 = 0;
            iVar4 = 1;
            iVar5 = 0;
            do {
              iVar4 = iVar4 * b;
              iVar5 = iVar5 * b + series[uVar7];
              uVar7 = uVar7 + 1;
            } while (k - 1 != uVar7);
          }
          if (k - 1 < m) {
            lVar8 = 0;
            do {
              lVar6 = (long)(iVar5 * b) + (long)series[k + lVar8 + -1];
              __ptr[lVar6] = __ptr[lVar6] + 1;
              iVar5 = (int)lVar6 - series[lVar8] * iVar4;
              lVar8 = lVar8 + 1;
            } while (lVar2 != lVar8);
          }
          sVar3 = sVar3 + 1;
          series = series + m;
        } while (sVar3 != n);
      }
      local_48.histogram = __ptr;
      local_48.size = __nmemb;
      dVar9 = inform_shannon_entropy(&local_48,2.0);
      free(__ptr);
    }
  }
  return dVar9;
}

Assistant:

double inform_block_entropy(int const *series, size_t n, size_t m, int b,
    size_t k, inform_error *err)
{
    if (check_arguments(series, n, m, b, k, err)) return NAN;

    size_t const states_size = (size_t) pow((double) b, (double) k);

    uint32_t *data = calloc(states_size, sizeof(uint32_t));
    if (data == NULL)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NAN);
    }

    size_t const N = n * (m - k + 1);

    inform_dist states = { data, states_size, N };

    accumulate_observations(series, n, m, b, k, &states);

    double be = inform_shannon_entropy(&states, 2.0);

    free(data);

    return be;
}